

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

OutPt * ClipperLib::GetBottomPt(OutPt *pp)

{
  bool bVar1;
  OutPt *local_20;
  OutPt *p;
  OutPt *dups;
  OutPt *pp_local;
  
  p = (OutPt *)0x0;
  dups = pp;
  for (local_20 = pp->Next; local_20 != dups; local_20 = local_20->Next) {
    if ((dups->Pt).Y < (local_20->Pt).Y) {
      dups = local_20;
      p = (OutPt *)0x0;
    }
    else if (((local_20->Pt).Y == (dups->Pt).Y) && ((local_20->Pt).X <= (dups->Pt).X)) {
      if ((local_20->Pt).X < (dups->Pt).X) {
        p = (OutPt *)0x0;
        dups = local_20;
      }
      else if ((local_20->Next != dups) && (local_20->Prev != dups)) {
        p = local_20;
      }
    }
  }
  if (p != (OutPt *)0x0) {
    while (p != local_20) {
      bVar1 = FirstIsBottomPt(local_20,p);
      if (!bVar1) {
        dups = p;
      }
      p = p->Next;
      while (bVar1 = operator!=(&p->Pt,&dups->Pt), bVar1) {
        p = p->Next;
      }
    }
  }
  return dups;
}

Assistant:

OutPt* GetBottomPt(OutPt *pp)
{
  OutPt* dups = 0;
  OutPt* p = pp->Next;
  while (p != pp)
  {
    if (p->Pt.Y > pp->Pt.Y)
    {
      pp = p;
      dups = 0;
    }
    else if (p->Pt.Y == pp->Pt.Y && p->Pt.X <= pp->Pt.X)
    {
      if (p->Pt.X < pp->Pt.X)
      {
        dups = 0;
        pp = p;
      } else
      {
        if (p->Next != pp && p->Prev != pp) dups = p;
      }
    }
    p = p->Next;
  }
  if (dups)
  {
    //there appears to be at least 2 vertices at BottomPt so ...
    while (dups != p)
    {
      if (!FirstIsBottomPt(p, dups)) pp = dups;
      dups = dups->Next;
      while (dups->Pt != pp->Pt) dups = dups->Next;
    }
  }
  return pp;
}